

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsettings.cpp
# Opt level: O3

QString * __thiscall
QSettingsPrivate::normalizedKey
          (QString *__return_storage_ptr__,QSettingsPrivate *this,QAnyStringView key)

{
  QObjectPrivate *pQVar1;
  char16_t *pcVar2;
  QSettingsPrivate *pQVar3;
  char16_t *pcVar4;
  QSettingsPrivate *pQVar5;
  QSettingsPrivate *pQVar6;
  ulong uVar7;
  QSettingsPrivate *pQVar8;
  QLatin1 *pQVar9;
  QLatin1StringView in;
  QByteArrayView in_00;
  QLatin1StringView in_01;
  QByteArrayView in_02;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  
  uVar7 = (ulong)key.field_0.m_data & 0x3fffffffffffffff;
  (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QString::QString(__return_storage_ptr__,uVar7,Uninitialized);
  pcVar2 = (__return_storage_ptr__->d).ptr;
  if ((QLatin1 *)pcVar2 == (QLatin1 *)0x0) {
    pcVar2 = &QString::_empty;
  }
  if (((ulong)key.field_0.m_data & 0xc000000000000000) == 0x4000000000000000) {
    if (((undefined1  [16])key & (undefined1  [16])0x3fffffffffffffff) != (undefined1  [16])0x0) {
      pQVar8 = (QSettingsPrivate *)
               ((long)&(this->super_QObjectPrivate).super_QObjectData._vptr_QObjectData + uVar7);
      pQVar3 = this;
      pQVar5 = this;
      do {
        while (this = (QSettingsPrivate *)
                      ((long)&(this->super_QObjectPrivate).super_QObjectData._vptr_QObjectData + 1),
              *(char *)&(pQVar5->super_QObjectPrivate).super_QObjectData._vptr_QObjectData != '/') {
          pcVar4 = (char16_t *)0x0;
          pQVar6 = this;
          do {
            if (pQVar6 == pQVar8) {
              in_01.m_data = (char *)pQVar3;
              in_01.m_size = (qsizetype)pQVar5;
              pQVar9 = (QLatin1 *)
                       QLatin1::convertToUnicode
                                 ((QLatin1 *)pcVar2,(char16_t *)((long)pQVar8 - (long)pQVar3),in_01)
              ;
              uVar7 = extraout_RDX;
              goto LAB_00426e2c;
            }
            this = (QSettingsPrivate *)
                   ((long)&(pQVar6->super_QObjectPrivate).super_QObjectData._vptr_QObjectData + 1);
            pcVar4 = (char16_t *)((long)pcVar4 + 1);
            pQVar1 = &pQVar6->super_QObjectPrivate;
            pQVar6 = this;
          } while (*(char *)&(pQVar1->super_QObjectData)._vptr_QObjectData != '/');
          in.m_data = (char *)pQVar3;
          in.m_size = (qsizetype)pQVar5;
          pcVar2 = QLatin1::convertToUnicode((QLatin1 *)pcVar2,pcVar4,in);
          *pcVar2 = L'/';
          pcVar2 = pcVar2 + 1;
          pQVar3 = this;
          pQVar5 = this;
          if (this == pQVar8) goto LAB_00426e0c;
        }
        pQVar5 = (QSettingsPrivate *)
                 ((long)&(pQVar5->super_QObjectPrivate).super_QObjectData._vptr_QObjectData + 1);
        pQVar3 = (QSettingsPrivate *)
                 ((long)&(pQVar3->super_QObjectPrivate).super_QObjectData._vptr_QObjectData + 1);
      } while (pQVar5 != pQVar8);
    }
  }
  else if (((undefined1  [16])key & (undefined1  [16])0x3fffffffffffffff) != (undefined1  [16])0x0)
  {
    pQVar8 = (QSettingsPrivate *)
             ((long)&(this->super_QObjectPrivate).super_QObjectData._vptr_QObjectData + uVar7);
    pQVar3 = this;
    pQVar5 = this;
    do {
      while (this = (QSettingsPrivate *)
                    ((long)&(this->super_QObjectPrivate).super_QObjectData._vptr_QObjectData + 1),
            *(char *)&(pQVar5->super_QObjectPrivate).super_QObjectData._vptr_QObjectData != '/') {
        pcVar4 = (char16_t *)0x0;
        pQVar6 = this;
        do {
          if (pQVar6 == pQVar8) {
            in_02.m_data = (storage_type *)pQVar3;
            in_02.m_size = (qsizetype)pQVar5;
            pQVar9 = (QLatin1 *)
                     QUtf8::convertToUnicode
                               ((QUtf8 *)pcVar2,(char16_t *)((long)pQVar8 - (long)pQVar3),in_02);
            uVar7 = extraout_RDX_00;
            goto LAB_00426e2c;
          }
          this = (QSettingsPrivate *)
                 ((long)&(pQVar6->super_QObjectPrivate).super_QObjectData._vptr_QObjectData + 1);
          pcVar4 = (char16_t *)((long)pcVar4 + 1);
          pQVar1 = &pQVar6->super_QObjectPrivate;
          pQVar6 = this;
        } while (*(char *)&(pQVar1->super_QObjectData)._vptr_QObjectData != '/');
        in_00.m_data = (storage_type *)pQVar3;
        in_00.m_size = (qsizetype)pQVar5;
        pcVar2 = QUtf8::convertToUnicode((QUtf8 *)pcVar2,pcVar4,in_00);
        *pcVar2 = L'/';
        pcVar2 = pcVar2 + 1;
        pQVar3 = this;
        pQVar5 = this;
        if (this == pQVar8) goto LAB_00426e0c;
      }
      pQVar5 = (QSettingsPrivate *)
               ((long)&(pQVar5->super_QObjectPrivate).super_QObjectData._vptr_QObjectData + 1);
      pQVar3 = (QSettingsPrivate *)
               ((long)&(pQVar3->super_QObjectPrivate).super_QObjectData._vptr_QObjectData + 1);
    } while (pQVar5 != pQVar8);
  }
LAB_00426e0c:
  pcVar4 = (__return_storage_ptr__->d).ptr;
  if ((QLatin1 *)pcVar4 == (QLatin1 *)0x0) {
    pcVar4 = &QString::_empty;
  }
  uVar7 = (ulong)(pcVar2 == pcVar4);
  pQVar9 = (QLatin1 *)((long)pcVar2 + uVar7 * 2 + -2);
LAB_00426e2c:
  pcVar2 = (__return_storage_ptr__->d).ptr;
  if (pcVar2 == (char16_t *)0x0) {
    pcVar2 = &QString::_empty;
  }
  QString::truncate(__return_storage_ptr__,(char *)((long)pQVar9 - (long)pcVar2 >> 1),uVar7);
  return __return_storage_ptr__;
}

Assistant:

QString QSettingsPrivate::normalizedKey(QAnyStringView key)
{
    QString result(key.size(), Qt::Uninitialized);
    auto out = const_cast<QChar*>(result.constData()); // don't detach

    const bool maybeEndsInSlash = key.visit([&out](auto key) {
        using View = decltype(key);

        auto it = key.begin();
        const auto end = key.end();

        while (it != end) {
            while (*it == u'/') {
                ++it;
                if (it == end)
                    return true;
            }
            auto mark = it;
            while (*it != u'/') {
                ++it;
                if (it == end)
                    break;
            }
            out = write(out, View{mark, it});
            if (it == end)
                return false;
            Q_ASSERT(*it == u'/');
            *out++ = u'/';
            ++it;
        }
        return true;
    });

    if (maybeEndsInSlash && out != result.constData())
        --out; // remove the trailing slash
    result.truncate(out - result.constData());
    return result;
}